

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.cpp
# Opt level: O1

HomogeneousMedium *
pbrt::HomogeneousMedium::Create(ParameterDictionary *parameters,FileLoc *loc,Allocator alloc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  memory_resource *pmVar2;
  short sVar3;
  undefined8 uVar4;
  float *pfVar5;
  bool bVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar8;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  float *pfVar9;
  float *pfVar10;
  PiecewiseLinearSpectrum *this;
  RGBSigmoidPolynomial *this_00;
  float fVar11;
  Float FVar12;
  SpectrumHandle sig_s;
  SpectrumHandle sig_a;
  SpectrumHandle Le;
  string preset;
  string local_d8;
  float local_b8;
  Float local_b4;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  local_b0;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  local_a8;
  undefined1 local_a0 [16];
  undefined1 local_90 [16];
  undefined1 local_80 [48];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  _Alloc_hider local_40;
  size_t local_38;
  SpectrumHandle local_30;
  
  local_a8.bits = 0;
  local_b0.bits = 0;
  paVar1 = &local_d8.field_2;
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"preset","");
  local_90._0_8_ = (ParsedParameter *)local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"");
  ParameterDictionary::GetOneString
            ((string *)(local_80 + 0x10),parameters,&local_d8,(string *)local_90);
  if ((ParsedParameter *)local_90._0_8_ != (ParsedParameter *)local_80) {
    operator_delete((void *)local_90._0_8_,
                    (ulong)((long)&(((string *)local_80._0_8_)->_M_dataplus)._M_p + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,
                    CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                             local_d8.field_2._M_local_buf[0]) + 1);
  }
  if (((ParsedParameter *)local_80._24_8_ != (ParsedParameter *)0x0) &&
     (bVar6 = GetMediumScatteringProperties
                        ((string *)(local_80 + 0x10),(SpectrumHandle *)&local_a8,
                         (SpectrumHandle *)&local_b0,alloc), !bVar6)) {
    local_d8._M_string_length = 0;
    local_d8.field_2._M_local_buf[0] = '\0';
    local_d8._M_dataplus._M_p = (pointer)paVar1;
    detail::stringPrintfRecursive<std::__cxx11::string&>
              (&local_d8,"Material preset \"%s\" not found.",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_80 + 0x10));
    Warning(loc,local_d8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_d8._M_dataplus._M_p,
                      CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                               local_d8.field_2._M_local_buf[0]) + 1);
    }
  }
  if ((pointer)local_a8.bits == (pointer)0x0) {
    local_d8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"sigma_a","");
    local_38 = 0;
    ParameterDictionary::GetOneSpectrum
              ((ParameterDictionary *)local_90,(string *)parameters,(SpectrumHandle *)&local_d8,
               (SpectrumType)&local_38,(Allocator)0x1);
    uVar4 = local_90._0_8_;
    local_a8.bits = local_90._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_d8._M_dataplus._M_p,
                      CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                               local_d8.field_2._M_local_buf[0]) + 1);
    }
    if ((ParsedParameter *)uVar4 == (ParsedParameter *)0x0) {
      iVar7 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,4,4);
      *(undefined4 *)CONCAT44(extraout_var,iVar7) = 0x3f800000;
      local_a8.bits = CONCAT44(extraout_var,iVar7) | 0x1000000000000;
    }
  }
  if ((pointer)local_b0.bits == (pointer)0x0) {
    local_d8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"sigma_s","");
    local_40._M_p = (pointer)0x0;
    ParameterDictionary::GetOneSpectrum
              ((ParameterDictionary *)local_90,(string *)parameters,(SpectrumHandle *)&local_d8,
               (SpectrumType)&local_40,(Allocator)0x1);
    uVar4 = local_90._0_8_;
    local_b0.bits = local_90._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_d8._M_dataplus._M_p,
                      CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                               local_d8.field_2._M_local_buf[0]) + 1);
    }
    if ((ParsedParameter *)uVar4 == (ParsedParameter *)0x0) {
      iVar7 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,4,4);
      *(undefined4 *)CONCAT44(extraout_var_00,iVar7) = 0x3f800000;
      local_b0.bits = CONCAT44(extraout_var_00,iVar7) | 0x1000000000000;
    }
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"Le","");
  local_50._8_8_ = (ParsedParameter *)0x0;
  ParameterDictionary::GetOneSpectrum
            ((ParameterDictionary *)local_a0,(string *)parameters,(SpectrumHandle *)&local_d8,
             (int)&local_50 + 8,(Allocator)0x2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,
                    CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                             local_d8.field_2._M_local_buf[0]) + 1);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"Lescale","");
  local_b4 = ParameterDictionary::GetOneFloat(parameters,&local_d8,1.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,
                    CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                             local_d8.field_2._M_local_buf[0]) + 1);
  }
  if ((ParsedParameter *)local_a0._0_8_ != (ParsedParameter *)0x0) {
    sVar3 = SUB82(local_a0._0_8_,6);
    if ((ulong)local_a0._0_8_ >> 0x32 == 0) {
      this = (PiecewiseLinearSpectrum *)(local_a0._0_8_ & 0xffffffffffff);
      if ((ulong)local_a0._0_8_ >> 0x31 == 0) {
        fVar11 = *(float *)&(this->lambdas).alloc.memoryResource;
      }
      else if (sVar3 == 2) {
        pfVar10 = (float *)(this->lambdas).nAlloc;
        pmVar2 = (this->values).alloc.memoryResource;
        if ((memory_resource *)0x1 < pmVar2) {
          lVar8 = (long)pmVar2 * 4 + -4;
          pfVar9 = pfVar10;
          do {
            pfVar9 = pfVar9 + 1;
            pfVar5 = pfVar9;
            if (*pfVar9 <= *pfVar10) {
              pfVar5 = pfVar10;
            }
            pfVar10 = pfVar5;
            lVar8 = lVar8 + -4;
          } while (lVar8 != 0);
        }
        fVar11 = *pfVar10;
      }
      else {
        fVar11 = PiecewiseLinearSpectrum::MaxValue(this);
      }
    }
    else if (SUB84(local_a0._0_8_,4) >> 0x11 < 3) {
      this_00 = (RGBSigmoidPolynomial *)(local_a0._0_8_ & 0xffffffffffff);
      if (sVar3 == 5) {
        local_b8 = this_00->c0;
        FVar12 = RGBSigmoidPolynomial::MaxValue((RGBSigmoidPolynomial *)&this_00->c1);
        fVar11 = FVar12 * local_b8;
      }
      else {
        fVar11 = RGBSigmoidPolynomial::MaxValue(this_00);
      }
    }
    else {
      fVar11 = 1.0;
      if (sVar3 == 6) {
        fVar11 = RGBIlluminantSpectrum::MaxValue
                           ((RGBIlluminantSpectrum *)(local_a0._0_8_ & 0xffffffffffff));
      }
    }
    if ((fVar11 != 0.0) || (NAN(fVar11))) {
      local_50._M_allocated_capacity = local_a0._0_8_;
      FVar12 = SpectrumToPhotometric((SpectrumHandle *)&local_50._M_allocated_capacity);
      local_b4 = local_b4 / FVar12;
      goto LAB_0030ea61;
    }
  }
  iVar7 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,4,4);
  *(undefined4 *)CONCAT44(extraout_var_01,iVar7) = 0;
  local_a0._0_8_ = CONCAT44(extraout_var_01,iVar7) | 0x1000000000000;
LAB_0030ea61:
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"scale","");
  local_b8 = ParameterDictionary::GetOneFloat(parameters,&local_d8,1.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,
                    CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                             local_d8.field_2._M_local_buf[0]) + 1);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"g","");
  local_a0._12_4_ = ParameterDictionary::GetOneFloat(parameters,&local_d8,0.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,
                    CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                             local_d8.field_2._M_local_buf[0]) + 1);
  }
  iVar7 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x88,8);
  local_d8._M_dataplus._M_p = (pointer)local_a8.bits;
  local_90._0_8_ = local_b0.bits;
  local_30.
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
           )(TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
             )local_a0._0_8_;
  HomogeneousMedium((HomogeneousMedium *)CONCAT44(extraout_var_02,iVar7),(SpectrumHandle *)&local_d8
                    ,(SpectrumHandle *)local_90,local_b8,&local_30,local_b4,(Float)local_a0._12_4_,
                    alloc);
  if ((ParsedParameter *)local_80._16_8_ != (ParsedParameter *)(local_80 + 0x20)) {
    operator_delete((void *)local_80._16_8_,
                    (ulong)((long)&(((string *)local_80._32_8_)->_M_dataplus)._M_p + 1));
  }
  return (HomogeneousMedium *)CONCAT44(extraout_var_02,iVar7);
}

Assistant:

HomogeneousMedium *HomogeneousMedium::Create(const ParameterDictionary &parameters,
                                             const FileLoc *loc, Allocator alloc) {
    SpectrumHandle sig_a = nullptr, sig_s = nullptr;
    std::string preset = parameters.GetOneString("preset", "");
    if (!preset.empty()) {
        if (!GetMediumScatteringProperties(preset, &sig_a, &sig_s, alloc))
            Warning(loc, "Material preset \"%s\" not found.", preset);
    }
    if (sig_a == nullptr) {
        sig_a =
            parameters.GetOneSpectrum("sigma_a", nullptr, SpectrumType::Unbounded, alloc);
        if (sig_a == nullptr)
            sig_a = alloc.new_object<ConstantSpectrum>(1.f);
    }
    if (sig_s == nullptr) {
        sig_s =
            parameters.GetOneSpectrum("sigma_s", nullptr, SpectrumType::Unbounded, alloc);
        if (sig_s == nullptr)
            sig_s = alloc.new_object<ConstantSpectrum>(1.f);
    }

    SpectrumHandle Le =
        parameters.GetOneSpectrum("Le", nullptr, SpectrumType::Illuminant, alloc);
    Float LeScale = parameters.GetOneFloat("Lescale", 1.f);
    if (Le == nullptr || Le.MaxValue() == 0)
        Le = alloc.new_object<ConstantSpectrum>(0.f);
    else
        LeScale /= SpectrumToPhotometric(Le);

    Float sigScale = parameters.GetOneFloat("scale", 1.f);
    Float g = parameters.GetOneFloat("g", 0.0f);

    return alloc.new_object<HomogeneousMedium>(sig_a, sig_s, sigScale, Le, LeScale, g,
                                               alloc);
}